

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O2

bool __thiscall FDiskFile::Open(FDiskFile *this,bool quiet)

{
  DWORD *pDVar1;
  FileReader *pFVar2;
  DWORD DVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  DiskEntry *__s;
  ulong *puVar7;
  size_t sVar8;
  uint uVar9;
  long lVar10;
  DiskEntry *pDVar11;
  DiskEntry *pDVar12;
  uint choicea;
  DWORD DVar13;
  uint uVar14;
  FUncompressedLump *pFVar15;
  DWORD i;
  ulong uVar16;
  bool bVar17;
  byte bVar18;
  DiskEntryList entries;
  DiskEntry entry;
  
  bVar18 = 0;
  DVar3 = anon_unknown.dwarf_7f8a08::GetEntryCount
                    ((this->super_FUncompressedFile).super_FResourceFile.Reader);
  iVar4 = DVar3 * 0x48;
  entries.Array = (DiskEntry *)0x0;
  entries.Most = 0;
  entries.Count = 0;
  __s = (DiskEntry *)0x0;
  uVar16 = 0;
  while( true ) {
    DVar13 = (DWORD)uVar16;
    bVar17 = DVar3 == 0;
    DVar3 = DVar3 - 1;
    if (bVar17) break;
    pFVar2 = (this->super_FUncompressedFile).super_FResourceFile.Reader;
    (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,&entry,0x48);
    entry.offset = (entry.offset >> 0x18 | (entry.offset & 0xff0000) >> 8 |
                    (entry.offset & 0xff00) << 8 | entry.offset << 0x18) + iVar4 + 8;
    entry.size = entry.size >> 0x18 | (entry.size & 0xff0000) >> 8 | (entry.size & 0xff00) << 8 |
                 entry.size << 0x18;
    pcVar6 = strrchr(entry.name,0x2e);
    if ((pcVar6 != (char *)0x0) && (iVar5 = strcasecmp(pcVar6,".wad"), iVar5 == 0)) {
      uVar14 = DVar13 + 1;
      if (entries.Most < uVar14) {
        uVar9 = (entries.Most >> 1) + entries.Most;
        if (entries.Most < 0x10) {
          uVar9 = 0x10;
        }
        entries.Most = uVar9;
        if (uVar9 < uVar14) {
          entries.Most = uVar14;
        }
        __s = (DiskEntry *)
              M_Realloc_Dbg(__s,(ulong)entries.Most * 0x48,
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./tarray.h"
                            ,0x1ad);
      }
      pDVar11 = &entry;
      pDVar12 = __s + uVar16;
      for (lVar10 = 0x12; uVar16 = (ulong)uVar14, entries.Count = uVar14, lVar10 != 0;
          lVar10 = lVar10 + -1) {
        *(undefined4 *)pDVar12->name = *(undefined4 *)pDVar11->name;
        pDVar11 = (DiskEntry *)((long)pDVar11 + (ulong)bVar18 * -8 + 4);
        pDVar12 = (DiskEntry *)((long)pDVar12 + (ulong)bVar18 * -8 + 4);
      }
    }
  }
  (this->super_FUncompressedFile).super_FResourceFile.NumLumps = DVar13;
  entries.Array = __s;
  if (DVar13 != 0) {
    puVar7 = (ulong *)operator_new__(uVar16 * 0x50 | 8);
    *puVar7 = uVar16;
    lVar10 = 0;
    pFVar15 = (FUncompressedLump *)(puVar7 + 1);
    do {
      FUncompressedLump::FUncompressedLump(pFVar15);
      lVar10 = lVar10 + -0x50;
      pFVar15 = pFVar15 + 1;
    } while (uVar16 * -0x50 - lVar10 != 0);
    (this->super_FUncompressedFile).Lumps = (FUncompressedLump *)(puVar7 + 1);
    lVar10 = 0x4c;
    for (uVar16 = 0; uVar16 < (this->super_FUncompressedFile).super_FResourceFile.NumLumps;
        uVar16 = uVar16 + 1) {
      pFVar15 = (this->super_FUncompressedFile).Lumps;
      sVar8 = strlen(__s->name);
      pcVar6 = (char *)operator_new__(sVar8 + 1);
      strcpy(pcVar6,__s->name);
      pDVar1 = (DWORD *)((long)&(pFVar15->super_FResourceLump)._vptr_FResourceLump + lVar10);
      *(FDiskFile **)(pDVar1 + -5) = this;
      *pDVar1 = __s->offset;
      pDVar1[-0x11] = __s->size;
      *(undefined1 *)(pDVar1 + -9) = 4;
      FString::operator=((FString *)(pDVar1 + -0xf),pcVar6);
      lVar10 = lVar10 + 0x50;
      __s = __s + 1;
    }
    if (!quiet) {
      Printf(", %d lumps\n");
    }
  }
  TArray<(anonymous_namespace)::DiskEntry,_(anonymous_namespace)::DiskEntry>::~TArray(&entries);
  return DVar13 != 0;
}

Assistant:

bool FDiskFile::Open(bool quiet)
{
	const DWORD entryCount = GetEntryCount(Reader);
	const DWORD dataOffest = GetDataOffset(entryCount);

	DiskEntryList entries;

	for (DWORD i = 0; i < entryCount; ++i)
	{
		DiskEntry entry;
		Reader->Read(&entry, sizeof entry);

		entry.offset = BigLong(entry.offset) + dataOffest;
		entry.size   = BigLong(entry.size);

		const char* const extension = strrchr(entry.name, '.');

		if (NULL != extension && 0 == stricmp(extension, ".wad"))
		{
			entries.Push(entry);
		}
	}

	NumLumps = entries.Size();

	if (0 == NumLumps)
	{
		return false;
	}

	Lumps = new FUncompressedLump[NumLumps];

	for (DWORD i = 0; i < NumLumps; ++i)
	{
		FUncompressedLump& lump = Lumps[i];
		const DiskEntry& entry = entries[i];

		char* const lumpName = new char[strlen(entry.name) + 1];
		strcpy(lumpName, entry.name);

		lump.Owner     = this;
		lump.Position  = entry.offset;
		lump.LumpSize  = entry.size;
		lump.Flags     = LUMPF_EMBEDDED;
		lump.FullName  = lumpName;
	}

	if (!quiet)
	{
		Printf(", %d lumps\n", NumLumps);
	}

	return true;
}